

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O3

YSRESULT __thiscall YsSoundPlayer::SoundData::ConvertTo8Bit(SoundData *this)

{
  uchar *puVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  uchar *puVar5;
  
  if (this->bit == 8) {
    return YSOK;
  }
  if (this->bit != 0x10) {
    return YSERR;
  }
  uVar2 = this->sizeInBytes;
  puVar3 = (uchar *)operator_new__((ulong)(uVar2 >> 1));
  puVar1 = this->dat;
  if ((ulong)uVar2 == 0) {
    if (puVar1 == (uchar *)0x0) {
      uVar2 = 0;
      goto LAB_00111cdf;
    }
  }
  else {
    uVar4 = 0;
    puVar5 = puVar3;
    do {
      *puVar5 = puVar1[uVar4];
      uVar4 = uVar4 + 2;
      puVar5 = puVar5 + 1;
    } while (uVar4 < uVar2);
  }
  operator_delete__(puVar1);
  uVar2 = this->sizeInBytes >> 1;
LAB_00111cdf:
  this->dat = puVar3;
  this->bit = 8;
  this->sizeInBytes = uVar2;
  return YSOK;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::ConvertTo8Bit(void)
{
	if(bit==8)
	{
		return YSOK;
	}
	else if(bit==16)
	{
		unsigned char *newDat=new unsigned char [sizeInBytes/2];
		for(int i=0; i<sizeInBytes; i+=2)
		{
			newDat[i/2]=dat[i];
		}
		delete [] dat;
		dat=newDat;
		bit=8;
		sizeInBytes/=2;
		return YSOK;
	}
	return YSERR;
}